

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * get_copy_of_container(container_t *c,uint8_t *typecode,_Bool copy_on_write)

{
  container_t *c_00;
  container_t *actual_container;
  shared_container_t *shared_container;
  _Bool copy_on_write_local;
  uint8_t *typecode_local;
  container_t *c_local;
  
  if (copy_on_write) {
    if (*typecode == '\x04') {
      *(int *)((long)c + 0xc) = *(int *)((long)c + 0xc) + 1;
      c_local = c;
    }
    else {
      if (*typecode == '\x04') {
        __assert_fail("*typecode != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x2d08,"container_t *get_copy_of_container(container_t *, uint8_t *, _Bool)")
        ;
      }
      c_local = malloc(0x10);
      if ((undefined8 *)c_local == (undefined8 *)0x0) {
        c_local = (container_t *)0x0;
      }
      else {
        *(container_t **)c_local = c;
        *(uint8_t *)((long)c_local + 8) = *typecode;
        *(undefined4 *)((long)c_local + 0xc) = 2;
        *typecode = '\x04';
      }
    }
  }
  else {
    c_00 = container_unwrap_shared(c,typecode);
    if (*typecode == '\x04') {
      __assert_fail("*typecode != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x2d19,"container_t *get_copy_of_container(container_t *, uint8_t *, _Bool)");
    }
    c_local = container_clone(c_00,*typecode);
  }
  return c_local;
}

Assistant:

container_t *get_copy_of_container(
    container_t *c, uint8_t *typecode,
    bool copy_on_write
){
    if (copy_on_write) {
        shared_container_t *shared_container;
        if (*typecode == SHARED_CONTAINER_TYPE) {
            shared_container = CAST_shared(c);
            shared_container->counter += 1;
            return shared_container;
        }
        assert(*typecode != SHARED_CONTAINER_TYPE);

        if ((shared_container = (shared_container_t *)malloc(
                 sizeof(shared_container_t))) == NULL) {
            return NULL;
        }

        shared_container->container = c;
        shared_container->typecode = *typecode;

        shared_container->counter = 2;
        *typecode = SHARED_CONTAINER_TYPE;

        return shared_container;
    }  // copy_on_write
    // otherwise, no copy on write...
    const container_t *actual_container = container_unwrap_shared(c, typecode);
    assert(*typecode != SHARED_CONTAINER_TYPE);
    return container_clone(actual_container, *typecode);
}